

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asm_writer.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_190be::AsmWriteWLADX::writeInstruction
          (AsmWriteWLADX *this,Pointer pc,int numBits,int numBytesUsed,string *param,
          string *line_comment,CombinationBool accumulator_wide,CombinationBool index_wide,
          Combination8 data_bank,Combination16 direct_page,bool is_predicted)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  byte *pbVar7;
  undefined8 uVar8;
  byte bVar9;
  FILE *pFVar10;
  char *pcVar11;
  ulong uVar12;
  
  prepareWrite(this,pc,true);
  pbVar7 = snestistics::RomAccessor::evalPtr(this->m_romData,pc);
  bVar9 = 1;
  if (this->m_options->asm_print_pc == false) {
    bVar9 = this->m_options->asm_print_bytes;
  }
  iVar1 = fprintf((FILE *)this->m_outFile,"    ");
  if ((bVar9 & 1) != 0) {
    uVar8 = 0x20;
    if (is_predicted) {
      uVar8 = 0x70;
    }
    iVar2 = fprintf((FILE *)this->m_outFile,"/*%c",uVar8);
    iVar1 = iVar1 + iVar2;
  }
  if (this->m_options->asm_print_register_sizes == true) {
    if (((uint3)accumulator_wide & 0x10000) == 0) {
      pFVar10 = (FILE *)this->m_outFile;
      iVar2 = 0x3f;
    }
    else if (((uint3)accumulator_wide & 0x100) == 0) {
      pFVar10 = (FILE *)this->m_outFile;
      iVar2 = 0x2a;
    }
    else {
      pFVar10 = (FILE *)this->m_outFile;
      if (((uint3)accumulator_wide & 1) == 0) {
        iVar2 = 0x6d;
      }
      else {
        iVar2 = 0x4d;
      }
    }
    fputc(iVar2,pFVar10);
    if (((uint3)index_wide & 0x10000) == 0) {
      pFVar10 = (FILE *)this->m_outFile;
      iVar2 = 0x3f;
    }
    else if (((uint3)index_wide & 0x100) == 0) {
      pFVar10 = (FILE *)this->m_outFile;
      iVar2 = 0x2a;
    }
    else {
      pFVar10 = (FILE *)this->m_outFile;
      if (((uint3)index_wide & 1) == 0) {
        iVar2 = 0x69;
      }
      else {
        iVar2 = 0x49;
      }
    }
    fputc(iVar2,pFVar10);
    fputc(0x20,(FILE *)this->m_outFile);
    iVar1 = iVar1 + 3;
  }
  if (this->m_options->asm_print_db == true) {
    if (((uint3)data_bank & 0x10000) == 0) {
      __assert_fail("data_bank.has_value",
                    "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/source/asm_writer.cpp"
                    ,0x179,
                    "void (anonymous namespace)::AsmWriteWLADX::writeInstruction(const Pointer, const int, const int, const std::string &, const std::string &, CombinationBool, CombinationBool, Combination8, Combination16, bool)"
                   );
    }
    if (((uint3)data_bank & 0x100) == 0) {
      iVar2 = fprintf((FILE *)this->m_outFile,"   ");
    }
    else {
      iVar2 = fprintf((FILE *)this->m_outFile,"%02X ",(ulong)((uint3)data_bank & 0xff));
    }
    iVar1 = iVar1 + iVar2;
  }
  if (this->m_options->asm_print_dp == true) {
    if (((uint)direct_page >> 0x18 & 1) == 0) {
      __assert_fail("direct_page.has_value",
                    "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/source/asm_writer.cpp"
                    ,0x182,
                    "void (anonymous namespace)::AsmWriteWLADX::writeInstruction(const Pointer, const int, const int, const std::string &, const std::string &, CombinationBool, CombinationBool, Combination8, Combination16, bool)"
                   );
    }
    if (((uint)direct_page >> 0x10 & 1) == 0) {
      iVar2 = fprintf((FILE *)this->m_outFile,"     ");
    }
    else {
      iVar2 = fprintf((FILE *)this->m_outFile,"%04X ",(ulong)((uint)direct_page & 0xffff));
    }
    iVar1 = iVar1 + iVar2;
  }
  if (this->m_options->asm_print_pc == true) {
    iVar2 = fprintf((FILE *)this->m_outFile,"%06X ",(ulong)pc);
    iVar1 = iVar1 + iVar2;
  }
  if (this->m_options->asm_print_bytes == true) {
    if (0 < numBytesUsed) {
      uVar12 = 0;
      do {
        iVar2 = fprintf((FILE *)this->m_outFile,"%02X ",(ulong)pbVar7[uVar12]);
        iVar1 = iVar1 + iVar2;
        uVar12 = uVar12 + 1;
      } while ((uint)numBytesUsed != uVar12);
    }
    if (numBytesUsed < 4) {
      iVar2 = numBytesUsed + -4;
      do {
        iVar3 = fprintf((FILE *)this->m_outFile,"   ");
        iVar1 = iVar1 + iVar3;
        iVar2 = iVar2 + 1;
      } while (iVar2 != 0);
    }
  }
  if ((~bVar9 & 1) == 0) {
    iVar2 = fprintf((FILE *)this->m_outFile,"*/ ");
    iVar1 = iVar1 + iVar2;
  }
  pcVar11 = *(char **)(snestistics::opCodeInfo + (ulong)*pbVar7 * 0x18 + 8);
  pFVar10 = (FILE *)this->m_outFile;
  if (this->m_options->asm_lower_case_op == true) {
    uVar4 = tolower((int)*pcVar11);
    uVar5 = tolower((int)pcVar11[1]);
    uVar6 = tolower((int)pcVar11[2]);
    iVar2 = fprintf(pFVar10,"%c%c%c",(ulong)uVar4,(ulong)uVar5,(ulong)uVar6);
  }
  else {
    iVar2 = fprintf(pFVar10,"%s",pcVar11);
  }
  iVar2 = iVar2 + iVar1;
  iVar1 = strcmp(*(char **)(snestistics::opCodeInfo + (ulong)*pbVar7 * 0x18 + 8),"BRL");
  if ((numBits != 0) && (iVar1 != 0)) {
    if (numBits == 8) {
      pcVar11 = ".b";
    }
    else if (numBits == 0x18) {
      pcVar11 = ".l";
    }
    else {
      if (numBits != 0x10) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/source/asm_writer.cpp"
                      ,0x1ab,
                      "void (anonymous namespace)::AsmWriteWLADX::writeInstruction(const Pointer, const int, const int, const std::string &, const std::string &, CombinationBool, CombinationBool, Combination8, Combination16, bool)"
                     );
      }
      pcVar11 = ".w";
    }
    iVar1 = fprintf((FILE *)this->m_outFile,pcVar11);
    iVar2 = iVar2 + iVar1;
  }
  if (param->_M_string_length != 0) {
    iVar1 = fprintf((FILE *)this->m_outFile," %s",(param->_M_dataplus)._M_p);
    iVar2 = iVar2 + iVar1;
  }
  iVar1 = 0x48;
  if (0x48 < iVar2) {
    iVar1 = iVar2;
  }
  writeCommentHelper(this,iVar2,(iVar1 - 0x45U & 0xfffffffc) + 0x48,line_comment);
  this->m_nextPC = numBytesUsed + pc;
  return;
}

Assistant:

void writeInstruction(const Pointer pc, const int numBits, const int numBytesUsed, const std::string &param, const std::string &line_comment, CombinationBool accumulator_wide, CombinationBool index_wide, Combination8 data_bank, Combination16 direct_page, bool is_predicted) {
		prepareWrite(pc);
		const uint8_t* data = m_romData.evalPtr(pc);

		bool overrideInstructionWithDB = false;

		if (numBytesUsed == 2 && data[0] == 0xF0 && data[1] == 0x80) {
			// WLA DX has a bug here, emit using .DB instad
			overrideInstructionWithDB = true;
		}

		// Keep track of bytes written so we can align comment column
		int nw = 0;

		const bool emitCommentPC = m_options.asm_print_pc || m_options.asm_print_bytes || overrideInstructionWithDB;

		nw += fprintf(m_outFile, "    ");
		if (emitCommentPC) {
			nw += fprintf(m_outFile, "/*%c", is_predicted ? 'p':' ');
		}

		if (m_options.asm_print_register_sizes) {
			if(!accumulator_wide.has_value) {
				fputc('?', m_outFile);
			} else if (accumulator_wide.single_value) {
				if (accumulator_wide.value) {
					fputc('M', m_outFile);
				} else {
					fputc('m', m_outFile);
				}
			} else {
				fputc('*', m_outFile);
			}
			if(!index_wide.has_value) {
				fputc('?', m_outFile);
			} else if (index_wide.single_value) {
				if (index_wide.value) {
					fputc('I', m_outFile);
				} else {
					fputc('i', m_outFile);
				}
			} else {
				fputc('*', m_outFile);
			}
			fputc(' ', m_outFile);
			nw += 3;
		}

		if (m_options.asm_print_db) {
			assert(data_bank.has_value);
			if (data_bank.single_value) {
				nw += fprintf(m_outFile, "%02X ", data_bank.value);
			} else {
				nw += fprintf(m_outFile, "   ");
			}
		}

		if (m_options.asm_print_dp) {
			assert(direct_page.has_value);
			if (direct_page.single_value) {
				nw += fprintf(m_outFile, "%04X ", direct_page.value);
			} else {
				nw += fprintf(m_outFile, "     ");
			}
		}

		if (m_options.asm_print_pc) {
			nw += fprintf(m_outFile, "%06X ", pc);
		}
		if (m_options.asm_print_bytes) {
			for (int k = 0; k < numBytesUsed; k++) {
				nw += fprintf(m_outFile, "%02X ", data[k]);
			}
			for (int k = numBytesUsed; k < 4; k++) {
				nw += fprintf(m_outFile, "   ");
			}
		}

		if (emitCommentPC && !overrideInstructionWithDB) {
			nw += fprintf(m_outFile, "*/ ");
		}

		const char * const op = opCodeInfo[data[0]].mnemonics;
		if (m_options.asm_lower_case_op) {
			nw += fprintf(m_outFile, "%c%c%c", tolower(op[0]), tolower(op[1]), tolower(op[2]));
		} else {
			nw += fprintf(m_outFile, "%s", op);
		}

		if (strcmp(opCodeInfo[data[0]].mnemonics, "BRL") == 0) {

		} else if (numBits == 0) {
		} else if (numBits == 8) {
			nw += fprintf(m_outFile, ".b");
		} else if (numBits == 16) {
			nw += fprintf(m_outFile, ".w");
		} else if (numBits == 24) {
			nw += fprintf(m_outFile, ".l");
		} else {
			assert(false);
		}

		if (!param.empty()) {
			nw += fprintf(m_outFile, " %s", param.c_str());
		}

		if (overrideInstructionWithDB) {
			nw += fprintf(m_outFile, "*/ ");
		}

		writeCommentHelper(nw, adjusted_column(nw), line_comment);

		if (overrideInstructionWithDB) {
			fprintf(m_outFile, ".DB ");
			for (int k = 0; k < numBytesUsed; k++) {
				fprintf(m_outFile, "$%02X%s", data[k], k != numBytesUsed-1 ? ", ":"");
			}
			fprintf(m_outFile, "\n");
		}

		m_nextPC = pc + numBytesUsed;
	}